

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

int decode_ssl_received_bytes(TLS_IO_INSTANCE *tls_io_instance)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  uchar local_68 [4];
  int rcv_bytes;
  uchar buffer [64];
  int result;
  TLS_IO_INSTANCE *tls_io_instance_local;
  
  l._4_4_ = 1;
  while( true ) {
    if (l._4_4_ < 1) {
      return 0;
    }
    if (tls_io_instance->ssl == (SSL *)0x0) break;
    l._4_4_ = SSL_read((SSL *)tls_io_instance->ssl,local_68,0x40);
    if (0 < l._4_4_) {
      if (tls_io_instance->on_bytes_received == (ON_BYTES_RECEIVED)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                    ,"decode_ssl_received_bytes",0x38a,1,"NULL on_bytes_received.");
        }
      }
      else {
        (*tls_io_instance->on_bytes_received)
                  (tls_io_instance->on_bytes_received_context,local_68,(long)l._4_4_);
      }
    }
  }
  p_Var1 = xlogging_get_log_function();
  if (p_Var1 != (LOGGER_LOG)0x0) {
    (*p_Var1)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
              ,"decode_ssl_received_bytes",0x380,1,
              "SSL channel closed in decode_ssl_received_bytes.");
  }
  return 0x381;
}

Assistant:

static int decode_ssl_received_bytes(TLS_IO_INSTANCE* tls_io_instance)
{
    int result = 0;
    unsigned char buffer[64];

    int rcv_bytes = 1;

    while (rcv_bytes > 0)
    {
        if (tls_io_instance->ssl == NULL)
        {
            LogError("SSL channel closed in decode_ssl_received_bytes.");
            result = MU_FAILURE;
            return result;
        }

        rcv_bytes = SSL_read(tls_io_instance->ssl, buffer, sizeof(buffer));
        if (rcv_bytes > 0)
        {
            if (tls_io_instance->on_bytes_received == NULL)
            {
                LogError("NULL on_bytes_received.");
            }
            else
            {
                tls_io_instance->on_bytes_received(tls_io_instance->on_bytes_received_context, buffer, rcv_bytes);
            }
        }
    }

    return result;
}